

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::TrendGroup> *
metaf::TrendGroup::fromTimeSpan(optional<metaf::TrendGroup> *__return_storage_ptr__,string *s)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 uStack_89;
  undefined4 uStack_85;
  string_type local_80;
  optional<metaf::MetafTime> till;
  optional<metaf::MetafTime> from;
  smatch match;
  
  if (fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,
                 "(\\d\\d\\d\\d)/(\\d\\d\\d\\d)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_);
    }
  }
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (s,&match,&fromTimeSpan(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  if (bVar2) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_80,&match,1);
    MetafTime::fromStringDDHH(&from,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_80,&match,2);
    MetafTime::fromStringDDHH(&till,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if ((from.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged == true) &&
       (till.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged != false)) {
      local_80._M_dataplus._M_p._3_5_ =
           from.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._0_5_;
      local_80._M_string_length._0_3_ =
           from.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._5_3_;
      local_80._M_string_length._3_4_ =
           (undefined4)
           from.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_;
      local_80._15_4_ =
           SUB84((ulong)from.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                        super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_ >> 0x20,0);
      uVar1 = local_80._15_4_;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x31) =
           till.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._17_2_;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x33) =
           till.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._19_1_;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::TrendGroup>._M_payload = 7;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.isTafTimeSpanGroup = true;
      local_80._M_string_length._7_1_ =
           (undefined1)
           ((ulong)from.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_ >> 0x20);
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 9)
           = CONCAT53(local_80._M_dataplus._M_p._3_5_,local_80._M_dataplus._M_p._0_3_);
      *(ulong *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload +
                0x11) =
           CONCAT17(local_80._M_string_length._7_1_,
                    CONCAT43(local_80._M_string_length._3_4_,(undefined3)local_80._M_string_length))
      ;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = uVar1
      ;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) = 1;
      *(undefined2 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
           from.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._17_2_;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1f) =
           from.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._19_1_;
      ((optional<unsigned_int> *)
      ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20))->
      super__Optional_base<unsigned_int,_true,_true> =
           (_Optional_base<unsigned_int,_true,_true>)
           till.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
           super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
      uStack_89 = (undefined4)
                  till.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                  super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) =
           uStack_89;
      uStack_85._0_1_ =
           (undefined1)
           ((ulong)till.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_ >> 0x20);
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) =
           (undefined1)uStack_85;
      uStack_85 = (undefined4)
                  ((ulong)till.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                          super__Optional_payload_base<metaf::MetafTime>._M_payload._8_8_ >> 0x20);
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) =
           uStack_85;
      *(bool *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)
                       ._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30
               ) = till.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::MetafTime>._M_engaged;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_engaged = true;
      local_80._15_4_ = uVar1;
      goto LAB_0018837e;
    }
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 8) = 0;
LAB_0018837e:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&match);
  return __return_storage_ptr__;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromTimeSpan(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("(\\d\\d\\d\\d)/(\\d\\d\\d\\d)");
	static const auto matchFrom = 1, matchTill = 2;
	std::smatch match;
	if (!regex_match(s, match, rgx)) return notRecognised;
	const auto from = MetafTime::fromStringDDHH(match.str(matchFrom));
	const auto till = MetafTime::fromStringDDHH(match.str(matchTill));
	if (!from.has_value() || !till.has_value()) return notRecognised;

	TrendGroup result;
	result.t = Type::TIME_SPAN;
	result.isTafTimeSpanGroup = true;
	result.tFrom = from;
	result.tTill = till;
	return result;
}